

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JxVariant.cpp
# Opt level: O0

bool __thiscall Jinx::Variant::CanConvertTo(Variant *this,ValueType type)

{
  undefined1 local_48 [8];
  Variant v;
  ValueType type_local;
  Variant *this_local;
  
  if ((this->m_type == type) || (type == Null)) {
    this_local._7_1_ = true;
  }
  else {
    v.field_1._28_4_ = type;
    Variant((Variant *)local_48,this);
    this_local._7_1_ = ConvertTo((Variant *)local_48,v.field_1._28_4_);
    ~Variant((Variant *)local_48);
  }
  return this_local._7_1_;
}

Assistant:

inline_t bool Variant::CanConvertTo(ValueType type) const
	{
		if (m_type == type || type == ValueType::Null)
			return true;
		Variant v = *this;
		return v.ConvertTo(type);
	}